

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<unsigned_int,_11UL>::vector_s
          (vector_s<unsigned_int,_11UL> *this,initializer_list<unsigned_int> *init)

{
  const_iterator last;
  size_type sVar1;
  pointer insert_ptr;
  size_type i;
  size_type diff;
  const_iterator end;
  const_iterator it;
  initializer_list<unsigned_int> *init_local;
  vector_s<unsigned_int,_11UL> *this_local;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  end = std::initializer_list<unsigned_int>::begin(init);
  last = std::initializer_list<unsigned_int>::end(init);
  sVar1 = vector_s<unsigned_int,11ul>::check_range<unsigned_int_const*>
                    ((vector_s<unsigned_int,11ul> *)this,end,last);
  insert_ptr = (pointer)0x0;
  for (; end != last; end = end + 1) {
    this->data_ptr_[(long)insert_ptr] = *end;
    insert_ptr = (pointer)((long)insert_ptr + 1);
  }
  this->size_ = sVar1;
  return;
}

Assistant:

vector_s(const std::initializer_list<T>& init)
    {
    //        std::cout << "vector_s(const std::initializer_list<T>& init) constructor this: " << this <<  std::endl;
        auto it = init.begin();
        const auto end = init.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
    }